

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeConsistentInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *M)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  element_type *peVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  double *pdVar9;
  ActualDstType actualDst;
  int i;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  double dVar53;
  ulong uVar54;
  ulong uVar55;
  double dVar56;
  double dVar57;
  ulong uVar58;
  double dVar59;
  double dVar60;
  ulong uVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  double local_158;
  double local_e0;
  
  lVar10 = 0;
  memset(M,0,0x480);
  dVar51 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x58))();
  dVar52 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x60))();
  dVar53 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x178))();
  uVar54 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x180))();
  uVar55 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x188))();
  dVar56 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 400))();
  dVar57 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x198))();
  uVar58 = (**(code **)((long)(((this->sectionB).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x58))();
  dVar59 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x60))();
  dVar60 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x178))();
  uVar61 = (**(code **)((long)(((this->sectionB).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x180))();
  dVar62 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x188))();
  dVar63 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 400))();
  dVar64 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x198))();
  dVar1 = this->length;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar1;
  peVar5 = (this->avg_sec_par).
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar2 = peVar5->phimz;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  auVar11 = vmulsd_avx512f(auVar13,auVar13);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar2;
  auVar12 = vaddsd_avx512f(auVar104,ZEXT816(0x3ff0000000000000));
  auVar13 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar12);
  auVar12 = vmulsd_avx512f(auVar13,auVar13);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar53;
  auVar14 = vmulsd_avx512f(auVar78,ZEXT816(0x4014000000000000));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar53 * 6.0;
  auVar15 = vdivsd_avx512f(auVar15,auVar14);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar51;
  auVar16 = vmulsd_avx512f(auVar98,auVar78);
  auVar17 = vmulsd_avx512f(auVar104,ZEXT816(0x3fe6666666666666));
  auVar17 = vfmadd231sd_avx512f(auVar17,auVar11,ZEXT816(0x3fd5555555555555));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar17._0_8_ + 0.37142857142857144;
  auVar17 = vmulsd_avx512f(auVar16,auVar20);
  vmovsd_avx512f(auVar16);
  dVar65 = auVar12._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar65 * auVar17._0_8_;
  auVar17 = vfmadd231sd_fma(auVar66,auVar12,auVar15);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar60;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar60 * 6.0;
  auVar15 = vdivsd_avx512f(auVar19,auVar14);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar58;
  auVar18 = vmulsd_avx512f(auVar92,auVar78);
  auVar19 = vmulsd_avx512f(auVar18,auVar20);
  vmovsd_avx512f(auVar18);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar65 * auVar19._0_8_;
  auVar19 = vfmadd231sd_fma(auVar24,auVar12,auVar15);
  auVar15 = vmulsd_avx512f(auVar104,ZEXT816(0x3fd3333333333333));
  auVar15 = vfmadd231sd_avx512f(auVar15,auVar11,ZEXT816(0x3fc5555555555555));
  dVar3 = peVar5->mu;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3;
  dVar6 = dVar1 * dVar3;
  dVar4 = peVar5->Jyy;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar4;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar4 * -6.0;
  auVar20 = vdivsd_avx512f(auVar21,auVar14);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar20._0_8_ * dVar65;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar6 * (auVar15._0_8_ + 0.12857142857142856);
  auVar20 = vfmadd231sd_fma(auVar22,auVar12,auVar67);
  auVar15 = vmulsd_avx512f(auVar104,ZEXT816(0x3fb7777777777777));
  auVar15 = vfmadd231sd_avx512f(auVar15,auVar11,ZEXT816(0x3fa5555555555555));
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar2;
  auVar21 = vfmadd213sd_avx512f(ZEXT816(0x3fe0000000000000),auVar105,ZEXT816(0xbfb999999999999a));
  auVar22 = vmulsd_avx512f(auVar23,auVar21);
  auVar23 = vmulsd_avx512f(auVar78,auVar78);
  auVar24 = vmulsd_avx512f(auVar98,auVar23);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar15._0_8_ + 0.05238095238095238;
  auVar15 = vmulsd_avx512f(auVar24,auVar30);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar22._0_8_ * dVar65;
  auVar66 = vfmsub231sd_fma(auVar25,auVar12,auVar15);
  auVar15 = vmulsd_avx512f(auVar92,auVar23);
  auVar22 = vmulsd_avx512f(auVar15,auVar30);
  auVar25 = vmulsd_avx512f(auVar94,auVar21);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar25._0_8_ * dVar65;
  auVar67 = vfmsub231sd_fma(auVar27,auVar12,auVar22);
  auVar22 = vmulsd_avx512f(auVar105,ZEXT816(0x3fb3333333333333));
  auVar22 = vfmadd231sd_avx512f(auVar22,auVar11,ZEXT816(0x3fa5555555555555));
  auVar26 = vmulsd_avx512f(auVar23,auVar26);
  auVar25 = vmulsd_avx512f(auVar79,auVar21);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar25._0_8_ * dVar65;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar26._0_8_ * (auVar22._0_8_ + 0.030952380952380953);
  auVar22 = vfmadd231sd_fma(auVar28,auVar12,auVar31);
  auVar27 = vmulsd_avx512f(auVar78,auVar23);
  dVar51 = dVar51 * auVar27._0_8_;
  auVar25 = vmulsd_avx512f(auVar105,ZEXT816(0x3f91111111111111));
  auVar28 = vfmadd231sd_avx512f(auVar25,auVar11,ZEXT816(0x3f81111111111111));
  auVar29 = vmulsd_avx512f(auVar105,ZEXT816(0x3fc5555555555555));
  auVar25 = vfmadd213sd_avx512f(ZEXT816(0x3fd5555555555555),auVar11,auVar29);
  dVar7 = dVar1 * (auVar25._0_8_ + 0.13333333333333333);
  auVar25 = vaddsd_avx512f(auVar28,ZEXT816(0x3f83813813813814));
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar51;
  auVar30 = vmulsd_avx512f(auVar95,auVar25);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar53 * dVar7 * dVar65;
  auVar30 = vfmadd231sd_avx512f(auVar73,auVar12,auVar30);
  auVar31 = vmulsd_avx512f(auVar92,auVar27);
  auVar25 = vmulsd_avx512f(auVar31,auVar25);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar65 * dVar60 * dVar7;
  auVar25 = vfmadd231sd_fma(auVar74,auVar12,auVar25);
  dVar3 = dVar3 * auVar27._0_8_;
  auVar11 = vfmadd213sd_avx512f(auVar11,ZEXT816(0xbfc5555555555555),auVar29);
  auVar27 = vaddsd_avx512f(auVar28,ZEXT816(0x3f7d41d41d41d41d));
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar65 * dVar4 * dVar1 * (auVar11._0_8_ + 0.03333333333333333);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar3 * auVar27._0_8_;
  auVar27 = vfmadd231sd_fma(auVar29,auVar12,auVar70);
  dVar4 = peVar5->phimy;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar4;
  auVar11 = vaddsd_avx512f(auVar45,ZEXT816(0x3ff0000000000000));
  auVar29 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar11);
  dVar53 = dVar4 * dVar4;
  auVar46 = ZEXT816(0x3fd5555555555555);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar4 * 0.7;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar53;
  auVar11 = vfmadd231sd_avx512f(auVar33,auVar80,auVar46);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar54;
  auVar12 = vmulsd_avx512f(auVar111,ZEXT816(0x4018000000000000));
  auVar12 = vdivsd_avx512f(auVar12,auVar14);
  auVar32 = vmulsd_avx512f(auVar29,auVar29);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar11._0_8_ + 0.37142857142857144;
  auVar11 = vmulsd_avx512f(auVar16,auVar34);
  auVar11 = vmulsd_avx512f(auVar32,auVar11);
  auVar33 = vfmadd231sd_avx512f(auVar11,auVar32,auVar12);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar61;
  auVar11 = vmulsd_avx512f(auVar107,ZEXT816(0x4018000000000000));
  auVar11 = vdivsd_avx512f(auVar11,auVar14);
  auVar12 = vmulsd_avx512f(auVar18,auVar34);
  dVar60 = auVar32._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar60 * auVar12._0_8_;
  auVar34 = vfmadd231sd_avx512f(auVar16,auVar32,auVar11);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar4 * 0.3;
  auVar43 = ZEXT816(0x3fc5555555555555);
  auVar11 = vfmadd231sd_avx512f(auVar35,auVar80,auVar43);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = peVar5->Jzz;
  auVar12 = vmulsd_avx512f(auVar71,ZEXT816(0xc018000000000000));
  auVar12 = vdivsd_avx512f(auVar12,auVar14);
  auVar12 = vmulsd_avx512f(auVar12,auVar32);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar6 * (auVar11._0_8_ + 0.12857142857142856);
  auVar16 = vfmadd231sd_fma(auVar12,auVar32,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar4 * 0.09166666666666666;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar53;
  auVar47 = ZEXT816(0x3fa5555555555555);
  auVar11 = vfmadd231sd_avx512f(auVar41,auVar81,auVar47);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar11._0_8_ + 0.05238095238095238;
  auVar11 = vmulsd_avx512f(auVar24,auVar42);
  auVar35 = vfmadd231sd_avx512f(ZEXT816(0xbfb999999999999a),auVar45,ZEXT816(0x3fe0000000000000));
  auVar12 = vmulsd_avx512f(auVar111,auVar35);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar54;
  auVar12 = vmulsd_avx512f(auVar12,auVar32);
  auVar36 = vfmsub231sd_avx512f(auVar12,auVar32,auVar11);
  auVar11 = vmulsd_avx512f(auVar15,auVar42);
  auVar12 = vmulsd_avx512f(auVar107,auVar35);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar12._0_8_ * dVar60;
  auVar28 = vfmsub231sd_fma(auVar44,auVar32,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4 * 0.075;
  auVar11 = vfmadd231sd_avx512f(auVar12,auVar81,auVar47);
  auVar12 = vmulsd_avx512f(auVar71,auVar35);
  auVar12 = vmulsd_avx512f(auVar12,auVar32);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = auVar26._0_8_ * (auVar11._0_8_ + 0.030952380952380953);
  auVar37 = vfmadd231sd_avx512f(auVar12,auVar32,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar4 * 0.016666666666666666;
  auVar12 = vfmadd231sd_fma(auVar38,auVar81,ZEXT816(0x3f81111111111111));
  dVar7 = auVar12._0_8_ + 0.009523809523809525;
  auVar38 = vmulsd_avx512f(auVar45,auVar43);
  auVar11 = vfmadd213sd_fma(auVar46,auVar81,auVar38);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (auVar11._0_8_ + 0.13333333333333333) * dVar1;
  auVar11 = vmulsd_avx512f(auVar112,auVar101);
  auVar11 = vmulsd_avx512f(auVar32,auVar11);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar51 * dVar7;
  auVar18 = vfmadd231sd_fma(auVar11,auVar32,auVar99);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar7;
  auVar11 = vmulsd_avx512f(auVar31,auVar48);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar61;
  auVar15 = vmulsd_avx512f(auVar108,auVar101);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = auVar15._0_8_ * dVar60;
  auVar24 = vfmadd231sd_fma(auVar90,auVar32,auVar11);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar53;
  auVar11 = vfmadd213sd_fma(ZEXT816(0xbfc5555555555555),auVar82,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar3 * (auVar12._0_8_ + 0.007142857142857143);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar60 * peVar5->Jzz * dVar1 * (auVar11._0_8_ + 0.03333333333333333);
  auVar26 = vfmadd231sd_fma(auVar49,auVar32,auVar39);
  auVar31 = vfmadd213sd_avx512f(auVar43,auVar45,ZEXT816(0xbfb5555555555555));
  auVar32 = vfmadd231sd_avx512f(ZEXT816(0xbfb5555555555555),auVar105,auVar43);
  auVar11 = vfmadd213sd_fma(ZEXT816(0x3fc5555555555555),auVar45,ZEXT816(0x3fc3333333333333));
  auVar39 = vfmadd213sd_avx512f(ZEXT816(0x3fc5555555555555),auVar105,ZEXT816(0x3fc3333333333333));
  auVar41 = ZEXT816(0x3fb5555555555555);
  auVar12 = vfmadd213sd_fma(auVar46,auVar45,auVar41);
  auVar40 = vfmadd213sd_avx512f(auVar46,auVar105,auVar41);
  auVar15 = vmulsd_avx512f(auVar105,auVar41);
  auVar15 = vfmadd231sd_fma(auVar15,auVar45,auVar41);
  auVar41 = vfmadd213sd_avx512f(auVar46,auVar45,ZEXT816(0x3fd6666666666666));
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar2;
  auVar42 = vfmadd231sd_avx512f(ZEXT816(0x3fd6666666666666),auVar106,auVar46);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar4 * 0.3333333333333333;
  auVar43 = vfmadd213sd_avx512f(auVar43,auVar106,auVar15);
  auVar38 = vfnmadd231sd_avx512f(auVar15,auVar106,auVar38);
  auVar15 = vfmadd213sd_fma(auVar47,auVar45,ZEXT816(0x3fa1111111111111));
  auVar44 = vfmadd231sd_avx512f(ZEXT816(0x3fa1111111111111),auVar106,auVar47);
  auVar45 = vfmadd213sd_avx512f(auVar45,ZEXT816(0x3fa5555555555555),ZEXT816(0x3fa999999999999a));
  auVar46 = vfmadd213sd_avx512f(ZEXT816(0x3fa5555555555555),auVar106,ZEXT816(0x3fa999999999999a));
  auVar15 = vmulsd_avx512f(auVar23,auVar15);
  auVar44 = vmulsd_avx512f(auVar23,auVar44);
  auVar45 = vmulsd_avx512f(auVar23,auVar45);
  auVar23 = vmulsd_avx512f(auVar23,auVar46);
  dVar2 = peVar5->Jyz;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar2;
  dVar3 = peVar5->Qy;
  dVar4 = peVar5->Qz;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar4;
  dVar7 = peVar5->Jxx;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       local_158 / 3.0;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar57;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar57 * 0.5;
  auVar46 = vmulsd_avx512f(auVar46,auVar29);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xc]
       = auVar46._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar56;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar56 * 0.5;
  auVar46 = vmulsd_avx512f(auVar47,auVar13);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x18]
       = auVar46._0_8_;
  auVar40 = vmulsd_avx512f(auVar78,auVar40);
  auVar46 = vmulsd_avx512f(auVar103,auVar40);
  auVar46 = vmulsd_avx512f(auVar13,auVar46);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = 0.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = auVar46._0_8_;
  auVar46 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar47 = vxorpd_avx512vl(auVar78,auVar46);
  auVar12 = vmulsd_avx512f(auVar12,auVar47);
  auVar48 = vmulsd_avx512f(auVar91,auVar12);
  auVar48 = vmulsd_avx512f(auVar29,auVar48);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = auVar48._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar6;
  auVar48 = vdivsd_avx512f(auVar83,ZEXT816(0x4018000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = auVar48._0_8_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar4 * 0.5;
  auVar48 = vmulsd_avx512f(auVar84,auVar29);
  auVar49 = vxorpd_avx512vl(auVar48,auVar46);
  dVar6 = (double)vmovlpd_avx(auVar49);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = dVar6;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar3 * 0.5;
  auVar49 = vmulsd_avx512f(auVar85,auVar13);
  auVar50 = vxorpd_avx512vl(auVar49,auVar46);
  dVar6 = (double)vmovlpd_avx(auVar50);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = dVar6;
  auVar39 = vmulsd_avx512f(auVar78,auVar39);
  auVar44 = vmulsd_avx512f(auVar76,auVar44);
  dVar65 = auVar47._0_8_;
  auVar32 = vmulsd_avx512f(auVar78,auVar32);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar3 * auVar32._0_8_;
  auVar32 = vmulsd_avx512f(auVar13,auVar75);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = 0.0;
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x78;
  vmovsd_avx512f(auVar32);
  *pdVar9 = *pdVar9;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar4 * auVar31._0_8_ * dVar65;
  auVar31 = vmulsd_avx512f(auVar29,auVar72);
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x84;
  vmovsd_avx512f(auVar31);
  *pdVar9 = *pdVar9;
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0xd;
  vmovsd_avx512f(auVar33);
  *pdVar9 = *pdVar9;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar55;
  auVar33 = vmulsd_avx512f(auVar109,ZEXT816(0x4018000000000000));
  auVar33 = vdivsd_avx512f(auVar33,auVar14);
  auVar50 = vmulsd_avx512f(auVar29,auVar13);
  dVar69 = auVar50._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = auVar33._0_8_ * dVar69;
  auVar33 = vmulsd_avx512f(auVar41,auVar47);
  auVar41 = vmulsd_avx512f(auVar103,auVar33);
  auVar41 = vmulsd_avx512f(auVar29,auVar41);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x25]
       = auVar41._0_8_;
  auVar41 = vmulsd_avx512f(auVar109,auVar21);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar55;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = auVar41._0_8_ * dVar69;
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x3d;
  vmovsd_avx512f(auVar36);
  *pdVar9 = *pdVar9;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x49]
       = auVar48._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = auVar16._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar62;
  auVar16 = vmulsd_avx512f(auVar102,ZEXT816(0x4018000000000000));
  auVar16 = vdivsd_avx512f(auVar16,auVar14);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar2 * -6.0;
  auVar14 = vdivsd_avx512f(auVar77,auVar14);
  auVar36 = vmulsd_avx512f(auVar68,auVar21);
  dVar51 = auVar36._0_8_ * dVar69;
  dVar53 = auVar14._0_8_ * dVar69;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = dVar53;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar11._0_8_ * dVar65 * dVar3;
  auVar11 = vmulsd_avx512f(auVar29,auVar14);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6d]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = dVar51;
  auVar14 = vxorpd_avx512vl(auVar37,auVar46);
  dVar6 = (double)vmovlpd_avx(auVar14);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = dVar6;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = auVar17._0_8_;
  dVar60 = auVar42._0_8_ * dVar1;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar57 * dVar60;
  auVar17 = vmulsd_avx512f(auVar13,auVar100);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x26]
       = auVar17._0_8_;
  auVar17 = vxorpd_avx512vl(auVar46,auVar66);
  dVar6 = (double)vmovlpd_avx(auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = dVar6;
  auVar17 = vxorpd_avx512vl(auVar35,auVar46);
  auVar17 = vmulsd_avx512f(auVar110,auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = auVar17._0_8_ * dVar69;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4a]
       = auVar49._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = dVar53;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = auVar20._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar39._0_8_ * dVar4;
  auVar17 = vmulsd_avx512f(auVar13,auVar86);
  auVar20 = vmulsd_avx512f(auVar68,auVar35);
  dVar6 = auVar20._0_8_ * dVar69;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6e]
       = auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = auVar22._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar6;
  auVar20 = vxorpd_avx512vl(auVar36,auVar46);
  dVar4 = (double)vmovlpd_avx(auVar20);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x86]
       = dVar4;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x27]
       = (dVar1 * dVar52) / 3.0;
  auVar20 = vxorpd_avx512vl(auVar23,auVar46);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar57 * auVar20._0_8_;
  auVar20 = vmulsd_avx512f(auVar13,auVar96);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x33]
       = auVar20._0_8_;
  auVar20 = vxorpd_avx512vl(auVar45,auVar46);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar56 * auVar20._0_8_;
  auVar20 = vmulsd_avx512f(auVar29,auVar97);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3f]
       = auVar20._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = 0.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x57]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[99] =
       auVar17._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1 * dVar7;
  auVar11 = vdivsd_avx512f(auVar11,ZEXT816(0x4018000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = auVar11._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = auVar15._0_8_ * dVar3;
  auVar11 = vmulsd_avx512f(auVar29,auVar93);
  auVar15 = vmulsd_avx512f(auVar13,auVar44);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7b]
       = auVar15._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = auVar30._0_8_;
  dVar65 = dVar65 * (auVar43._0_8_ + 0.13333333333333333);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar65;
  auVar17 = vmulsd_avx512f(auVar110,auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = dVar69 * auVar17._0_8_;
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x4c;
  vmovsd_avx512f(auVar32);
  *pdVar9 = *pdVar9;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar51;
  auVar17 = vxorpd_avx512vl(auVar88,auVar46);
  dVar3 = (double)vmovlpd_avx(auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x58]
       = dVar3;
  auVar17 = vxorpd_avx512vl(auVar22,auVar46);
  dVar3 = (double)vmovlpd_avx(auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = dVar3;
  auVar15 = vxorpd_avx512vl(auVar15,auVar46);
  dVar3 = (double)vmovlpd_avx(auVar15);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x70]
       = dVar3;
  auVar15 = vxorpd_avx512vl(auVar46,auVar27);
  dVar3 = (double)vmovlpd_avx(auVar15);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = dVar3;
  dVar3 = dVar1 * (auVar38._0_8_ + 0.03333333333333333) * dVar2 * dVar69;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = auVar18._0_8_;
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x4d;
  vmovsd_avx512f(auVar31);
  *pdVar9 = *pdVar9;
  pdVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x59;
  vmovsd_avx512f(auVar37);
  *pdVar9 = *pdVar9;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = dVar6;
  auVar11 = vxorpd_avx512vl(auVar11,auVar46);
  dVar2 = (double)vmovlpd_avx(auVar11);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x71]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = dVar3;
  auVar11 = vxorpd_avx512vl(auVar46,auVar26);
  dVar2 = (double)vmovlpd_avx(auVar11);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_e0 / 3.0;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar64;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar64 * -0.5;
  auVar11 = vmulsd_avx512f(auVar32,auVar29);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = auVar11._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar63;
  auVar11 = vmulsd_avx512f(auVar87,auVar40);
  auVar11 = vmulsd_avx512f(auVar13,auVar11);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar64 * dVar60;
  auVar15 = vmulsd_avx512f(auVar13,auVar50);
  auVar17 = vmulsd_avx512f(auVar89,auVar23);
  auVar17 = vmulsd_avx512f(auVar13,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar63 * -0.5;
  auVar20 = vmulsd_avx512f(auVar18,auVar13);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = auVar20._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = 0.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = auVar11._0_8_;
  auVar11 = vmulsd_avx512f(auVar89,auVar12);
  auVar11 = vmulsd_avx512f(auVar29,auVar11);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = auVar34._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = dVar69 * auVar16._0_8_;
  auVar11 = vmulsd_avx512f(auVar87,auVar45);
  auVar12 = vmulsd_avx512f(auVar87,auVar33);
  auVar11 = vmulsd_avx512f(auVar29,auVar11);
  auVar12 = vmulsd_avx512f(auVar29,auVar12);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x73]
       = auVar12._0_8_;
  auVar12 = vxorpd_avx512vl(auVar21,auVar46);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = dVar62 * auVar12._0_8_ * dVar69;
  auVar12 = vxorpd_avx512vl(auVar46,auVar28);
  dVar2 = (double)vmovlpd_avx(auVar12);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = auVar19._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x74]
       = auVar15._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = auVar67._0_8_;
  auVar12 = vmulsd_avx512f(auVar102,auVar35);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = auVar12._0_8_ * dVar69;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = (dVar1 * dVar59) / 3.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = auVar25._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = dVar69 * dVar62 * dVar65;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = auVar24._0_8_;
  do {
    lVar8 = -0xc;
    pdVar9 = (double *)M;
    do {
      *(double *)((long)M + (lVar8 + 0xc) * 8) = *pdVar9;
      pdVar9 = pdVar9 + 0xc;
      lVar8 = lVar8 + 1;
    } while (lVar10 + lVar8 != 0);
    lVar10 = lVar10 + 1;
    M = (ChMatrixNM<double,_12,_12> *)((long)M + 0x68);
  } while (lVar10 != 0xc);
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeConsistentInertiaMatrix(ChMatrixNM<double, 12, 12>& M) {
    M.setZero();

    double mu1 = this->sectionA->GetMassPerUnitLength();
    double Jxx1 = this->sectionA->GetInertiaJxxPerUnitLength();
    double Jyy1 = this->sectionA->GetInertiaJyyPerUnitLength();
    double Jzz1 = this->sectionA->GetInertiaJzzPerUnitLength();
    double Jyz1 = this->sectionA->GetInertiaJyzPerUnitLength();
    double Qy1 = this->sectionA->GetInertiaQyPerUnitLength();
    double Qz1 = this->sectionA->GetInertiaQzPerUnitLength();

    double mu2 = this->sectionB->GetMassPerUnitLength();
    double Jxx2 = this->sectionB->GetInertiaJxxPerUnitLength();
    double Jyy2 = this->sectionB->GetInertiaJyyPerUnitLength();
    double Jzz2 = this->sectionB->GetInertiaJzzPerUnitLength();
    double Jyz2 = this->sectionB->GetInertiaJyzPerUnitLength();
    double Qy2 = this->sectionB->GetInertiaQyPerUnitLength();
    double Qz2 = this->sectionB->GetInertiaQzPerUnitLength();

    double L = this->GetLength();
    double LL = L * L;
    double LLL = LL * L;
    double mu = this->avg_sec_par->mu;
    double Jyy = this->avg_sec_par->Jyy;
    double Jzz = this->avg_sec_par->Jzz;
    double Jyz = this->avg_sec_par->Jyz;
    double Jxx = this->avg_sec_par->Jxx;
    double Qy = this->avg_sec_par->Qy;
    double Qz = this->avg_sec_par->Qz;
    double phiy = this->avg_sec_par->phimy;
    double phiz = this->avg_sec_par->phimz;

    double phiy2 = phiy * phiy;
    double phiz2 = phiz * phiz;
    double oneplusphiy = 1.0 / (phiy + 1.);
    double oneplusphiz = 1.0 / (phiz + 1.);
    double oneplusphiy2 = oneplusphiy * oneplusphiy;
    double oneplusphiz2 = oneplusphiz * oneplusphiz;
    double oneplusphiyz = oneplusphiy * oneplusphiz;

    double rAy1 =
        6. * Jyy1 / (5. * L) * oneplusphiz2 + mu1 * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    double rAz1 =
        6. * Jzz1 / (5. * L) * oneplusphiy2 + mu1 * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;
    double rAy2 =
        6. * Jyy2 / (5. * L) * oneplusphiz2 + mu2 * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    double rAz2 =
        6. * Jzz2 / (5. * L) * oneplusphiy2 + mu2 * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;
    // double rAy =
    // 6. * Jyy / (5. * L) * oneplusphiz2 + mu * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    // double rAz =
    // 6. * Jzz / (5. * L) * oneplusphiy2 + mu * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;

    double rBy =
        (mu * L * (1. / 6. * phiz2 + 3. / 10. * phiz + 9. / 70.)) * oneplusphiz2 - 6. * Jyy / (5. * L) * oneplusphiz2;
    double rBz =
        (mu * L * (1. / 6. * phiy2 + 3. / 10. * phiy + 9. / 70.)) * oneplusphiy2 - 6. * Jzz / (5. * L) * oneplusphiy2;

    double rCy1 = (mu1 * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
                  (1. / 2. * phiz - 1. / 10.) * Jyy1 * oneplusphiz2;
    double rCz1 = (mu1 * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
                  (1. / 2. * phiy - 1. / 10.) * Jzz1 * oneplusphiy2;
    double rCy2 = (mu2 * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
                  (1. / 2. * phiz - 1. / 10.) * Jyy2 * oneplusphiz2;
    double rCz2 = (mu2 * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
                  (1. / 2. * phiy - 1. / 10.) * Jzz2 * oneplusphiy2;
    // double rCy = (mu * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
    //(1. / 2. * phiz - 1. / 10.) * Jyy * oneplusphiz2;
    // double rCz = (mu * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
    //(1. / 2. * phiy - 1. / 10.) * Jzz * oneplusphiy2;

    double rDy = (mu * LL * (1. / 24. * phiz2 + 3. / 40. * phiz + 13. / 420.)) * oneplusphiz2 +
                 (1. / 2. * phiz - 1. / 10.) * Jyy * oneplusphiz2;
    double rDz = (mu * LL * (1. / 24. * phiy2 + 3. / 40. * phiy + 13. / 420.)) * oneplusphiy2 +
                 (1. / 2. * phiy - 1. / 10.) * Jzz * oneplusphiy2;

    double rEy1 = mu1 * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
                  L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy1 * oneplusphiz2;
    double rEz1 = mu1 * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
                  L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz1 * oneplusphiy2;
    double rEy2 = mu2 * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
                  L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy2 * oneplusphiz2;
    double rEz2 = mu2 * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
                  L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz2 * oneplusphiy2;
    // double rEy = mu * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
    // L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy * oneplusphiz2;
    // double rEz = mu * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
    // L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz * oneplusphiy2;

    double rFy = (mu * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 140.)) * oneplusphiz2 +
                 L * (-1. / 6. * phiz2 + 1. / 6. * phiz + 1. / 30.) * Jyy * oneplusphiz2;
    double rFz = (mu * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 140.)) * oneplusphiy2 +
                 L * (-1. / 6. * phiy2 + 1. / 6. * phiy + 1. / 30.) * Jzz * oneplusphiy2;

    double rGy1 = Qy1 / 2. * oneplusphiz;
    double rGz1 = Qz1 / 2. * oneplusphiy;
    double rGy2 = Qy2 / 2. * oneplusphiz;
    double rGz2 = Qz2 / 2. * oneplusphiy;
    double rGy = Qy / 2. * oneplusphiz;
    double rGz = Qz / 2. * oneplusphiy;

    double rHy1 = L * (1. / 3. * phiy + 1. / 12.) * Qz1 * oneplusphiy;
    double rHz1 = L * (1. / 3. * phiz + 1. / 12.) * Qy1 * oneplusphiz;
    double rHy2 = L * (1. / 3. * phiy + 1. / 12.) * Qz2 * oneplusphiy;
    double rHz2 = L * (1. / 3. * phiz + 1. / 12.) * Qy2 * oneplusphiz;
    // double rHy = L * (1. / 3. * phiy + 1. / 12.) * Qz * oneplusphiy;
    // double rHz = L * (1. / 3. * phiz + 1. / 12.) * Qy * oneplusphiz;

    double rIy = L * (1. / 6. * phiy - 1. / 12.) * Qz * oneplusphiy;
    double rIz = L * (1. / 6. * phiz - 1. / 12.) * Qy * oneplusphiz;

    double rJyz1 = 6. * Jyz1 / (5. * L) * oneplusphiyz;
    double rJyz2 = 6. * Jyz2 / (5. * L) * oneplusphiyz;
    double rJyz = 6. * Jyz / (5. * L) * oneplusphiyz;

    double rKy = L * (1. / 6. * phiy + 3. / 20.) * Qy * oneplusphiy;
    double rKz = L * (1. / 6. * phiz + 3. / 20.) * Qz * oneplusphiz;

    double rLy1 = L * (1. / 3. * phiy + 7. / 20.) * Qy1 * oneplusphiy;
    double rLz1 = L * (1. / 3. * phiz + 7. / 20.) * Qz1 * oneplusphiz;
    double rLy2 = L * (1. / 3. * phiy + 7. / 20.) * Qy2 * oneplusphiy;
    double rLz2 = L * (1. / 3. * phiz + 7. / 20.) * Qz2 * oneplusphiz;
    // double rLy = L * (1. / 3. * phiy + 7. / 20.) * Qy * oneplusphiy;
    // double rLz = L * (1. / 3. * phiz + 7. / 20.) * Qz * oneplusphiz;

    double rMy1 = (1. / 2. * phiy - 1. / 10.) * Jyz1 * oneplusphiyz;
    double rMz1 = (1. / 2. * phiz - 1. / 10.) * Jyz1 * oneplusphiyz;
    double rMy2 = (1. / 2. * phiy - 1. / 10.) * Jyz2 * oneplusphiyz;
    double rMz2 = (1. / 2. * phiz - 1. / 10.) * Jyz2 * oneplusphiyz;
    double rMy = (1. / 2. * phiy - 1. / 10.) * Jyz * oneplusphiyz;
    double rMz = (1. / 2. * phiz - 1. / 10.) * Jyz * oneplusphiyz;

    double rNyz1 = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz1 * oneplusphiyz;
    double rNyz2 = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz2 * oneplusphiyz;
    // double rNyz = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz * oneplusphiyz;

    double rOyz = L * (1. / 12. * phiy + 1. / 12. * phiz - 1. / 6. * phiy * phiz + 1. / 30.) * Jyz * oneplusphiyz;
    double rPy = LL * (1. / 24. * phiy + 1. / 30.) * Qy * oneplusphiy;
    double rPz = LL * (1. / 24. * phiz + 1. / 30.) * Qz * oneplusphiz;

    double rQy1 = LL * (1. / 24. * phiy + 1. / 20.) * Qy1 * oneplusphiy;
    double rQz1 = LL * (1. / 24. * phiz + 1. / 20.) * Qz1 * oneplusphiz;
    double rQy2 = LL * (1. / 24. * phiy + 1. / 20.) * Qy2 * oneplusphiy;
    double rQz2 = LL * (1. / 24. * phiz + 1. / 20.) * Qz2 * oneplusphiz;
    // double rQy = LL * (1. / 24. * phiy + 1. / 20.) * Qy * oneplusphiy;
    // double rQz = LL * (1. / 24. * phiz + 1. / 20.) * Qz * oneplusphiz;

    M(0, 0) = mu1 * L / 3.;
    M(1, 0) = rGz1;
    M(2, 0) = rGy1;
    M(3, 0) = 0.;
    M(4, 0) = rHz1;
    M(5, 0) = -rHy1;

    M(6, 0) = mu * L / 6.;
    M(7, 0) = -rGz;
    M(8, 0) = -rGy;
    M(9, 0) = 0.;
    M(10, 0) = rIz;
    M(11, 0) = -rIy;

    M(1, 1) = rAz1;
    M(2, 1) = rJyz1;
    M(3, 1) = -rLy1;
    M(4, 1) = rMz1;
    M(5, 1) = rCz1;

    M(6, 1) = rGz;
    M(7, 1) = rBz;
    M(8, 1) = -rJyz;
    M(9, 1) = -rKy;
    M(10, 1) = rMz;
    M(11, 1) = -rDz;

    M(2, 2) = rAy1;
    M(3, 2) = rLz1;
    M(4, 2) = -rCy1;
    M(5, 2) = -rMy1;

    M(6, 2) = rGy;
    M(7, 2) = -rJyz;
    M(8, 2) = rBy;
    M(9, 2) = rKz;
    M(10, 2) = rDy;
    M(11, 2) = -rMy;

    M(3, 3) = L * Jxx1 / 3.;
    M(4, 3) = -rQz1;
    M(5, 3) = -rQy1;

    M(6, 3) = 0.;
    M(7, 3) = -rKy;
    M(8, 3) = rKz;
    M(9, 3) = L * Jxx / 6.;
    M(10, 3) = rPz;
    M(11, 3) = rPy;

    M(4, 4) = rEy1;
    M(5, 4) = -rNyz1;

    M(6, 4) = rIz;
    M(7, 4) = -rMz;
    M(8, 4) = -rDy;
    M(9, 4) = -rPz;
    M(10, 4) = -rFy;
    M(11, 4) = rOyz;

    M(5, 5) = rEz1;

    M(6, 5) = -rIy;
    M(7, 5) = rDz;
    M(8, 5) = rMy;
    M(9, 5) = -rPy;
    M(10, 5) = rOyz;
    M(11, 5) = -rFz;

    M(6, 6) = mu2 * L / 3.;
    M(7, 6) = -rGz2;
    M(8, 6) = -rGy2;
    M(9, 6) = 0.;
    M(10, 6) = rHz2;
    M(11, 6) = -rHy2;
    M(7, 7) = rAz2;
    M(8, 7) = rJyz2;
    M(9, 7) = -rLy2;
    M(10, 7) = -rMz2;
    M(11, 7) = -rCz2;
    M(8, 8) = rAy2;
    M(9, 8) = rLz2;
    M(10, 8) = rCy2;
    M(11, 8) = rMy2;
    M(9, 9) = L * Jxx2 / 3.;
    M(10, 9) = rQz2;
    M(11, 9) = rQy2;
    M(10, 10) = rEy2;
    M(11, 10) = -rNyz2;
    M(11, 11) = rEz2;

    // obtain the symmetric right-top elements by mirror
    for (int i = 0; i < 12; i++) {
        for (int j = i; j < 12; j++) {
            M(i, j) = M(j, i);
        }
    }
}